

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfVecAttribute.cpp
# Opt level: O3

void __thiscall
Imf_3_4::TypedAttribute<Imath_3_2::Vec2<int>_>::writeValueTo
          (TypedAttribute<Imath_3_2::Vec2<int>_> *this,OStream *os,int version)

{
  undefined8 in_RAX;
  int local_18;
  int local_14;
  
  _local_18 = CONCAT44((int)((ulong)in_RAX >> 0x20),(this->_value).x);
  (*os->_vptr_OStream[2])(os,&local_18,4);
  _local_18 = CONCAT44((this->_value).y,local_18);
  (*os->_vptr_OStream[2])(os,&local_14,4);
  return;
}

Assistant:

IMF_EXPORT void
V2iAttribute::writeValueTo (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os, int version) const
{
    Xdr::write<StreamIO> (os, _value.x);
    Xdr::write<StreamIO> (os, _value.y);
}